

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bool utilities::replace(string *str,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t start_pos;
  
  uVar1 = std::__cxx11::string::find(in_RDI,in_RSI);
  if (uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)in_RDI,uVar1,psVar2);
  }
  return uVar1 != 0xffffffffffffffff;
}

Assistant:

bool replace(std::string& str, const std::string& from, const std::string& to)
    {
        size_t start_pos = str.find(from);
        if(start_pos == std::string::npos)
        {
            return false;
        }
        str.replace(start_pos, from.length(), to);
        return true;
    }